

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::detail::SocketStream::SocketStream
          (SocketStream *this,socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
          time_t write_timeout_sec,time_t write_timeout_usec,time_t max_timeout_msec,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          start_time)

{
  allocator_type local_a;
  value_type local_9;
  
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__SocketStream_00292e00;
  this->sock_ = sock;
  this->read_timeout_sec_ = read_timeout_sec;
  this->read_timeout_usec_ = read_timeout_usec;
  this->write_timeout_sec_ = write_timeout_sec;
  this->write_timeout_usec_ = write_timeout_usec;
  this->max_timeout_msec_ = max_timeout_msec;
  (this->start_time_).__d.__r = (rep)start_time.__d.__r;
  local_9 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->read_buff_,0x1000,&local_9,&local_a);
  this->read_buff_off_ = 0;
  this->read_buff_content_size_ = 0;
  return;
}

Assistant:

inline SocketStream::SocketStream(
    socket_t sock, time_t read_timeout_sec, time_t read_timeout_usec,
    time_t write_timeout_sec, time_t write_timeout_usec,
    time_t max_timeout_msec,
    std::chrono::time_point<std::chrono::steady_clock> start_time)
    : sock_(sock), read_timeout_sec_(read_timeout_sec),
      read_timeout_usec_(read_timeout_usec),
      write_timeout_sec_(write_timeout_sec),
      write_timeout_usec_(write_timeout_usec),
      max_timeout_msec_(max_timeout_msec), start_time_(start_time),
      read_buff_(read_buff_size_, 0) {}